

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

void __thiscall
webfront::msg::FunctionCall::
encodeParameter<int,webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
          (FunctionCall *this,int *t,Frame<webfront::networking::TCPNetworkingTS> *frame)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  uint8_t uVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  FunctionCall *this_00;
  ostream *poVar4;
  reference pvVar5;
  size_t sVar6;
  span<std::byte,_18446744073709551615UL> *in_RDX;
  int *in_RSI;
  FunctionCall *in_RDI;
  string_view buffer;
  string_view sVar7;
  double number;
  anon_class_24_3_42224fb6 encodeString;
  anon_class_8_1_8991fb9c encodeType;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  byte *in_stack_ffffffffffffff78;
  unsigned_long in_stack_ffffffffffffff80;
  byte *in_stack_ffffffffffffff88;
  FunctionCall *in_stack_ffffffffffffff98;
  Frame<webfront::networking::TCPNetworkingTS> *this_01;
  
  uVar1 = getParametersCount(in_RDI);
  setParametersCount(in_RDI,uVar1 + '\x01');
  poVar2 = std::operator<<((ostream *)&std::cout,"Param: ");
  buffer = typeName<int>(in_stack_ffffffffffffff98);
  __str._M_str = (char *)in_RDI;
  __str._M_len = in_stack_ffffffffffffff68;
  pbVar3 = std::operator<<(in_stack_ffffffffffffff60,__str);
  this_00 = (FunctionCall *)std::operator<<(pbVar3," -> ");
  sVar7 = typeName<int>(in_stack_ffffffffffffff98);
  this_01 = (Frame<webfront::networking::TCPNetworkingTS> *)sVar7._M_str;
  __str_00._M_str = (char *)in_RDI;
  __str_00._M_len = in_stack_ffffffffffffff68;
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)this_00,__str_00);
  poVar4 = std::operator<<(pbVar3," : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_RSI);
  std::operator<<(poVar4,"\n");
  http::std::array<std::byte,_1024UL>::operator[]
            ((array<std::byte,_1024UL> *)this_00,(size_type)poVar2);
  http::std::span<std::byte,_18446744073709551615UL>::span<std::byte_*>
            ((span<std::byte,_18446744073709551615UL> *)in_RDI,(byte *)in_RDX,(size_type)this_00);
  http::std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_18446744073709551615UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_RDI,in_RDX);
  websocket::Frame<webfront::networking::TCPNetworkingTS>::addBuffer
            (this_01,(span<const_std::byte,_18446744073709551615UL>)buffer);
  in_RDI->encodeBufferIndex = in_RDI->encodeBufferIndex + 1;
  pvVar5 = http::std::array<std::byte,_1024UL>::operator[]
                     ((array<std::byte,_1024UL> *)this_00,(size_type)poVar2);
  *pvVar5 = 3;
  http::std::array<std::byte,_1024UL>::operator[]
            ((array<std::byte,_1024UL> *)this_00,(size_type)poVar2);
  std::copy_n<std::byte_const*,unsigned_long,std::byte*>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  in_RDI->encodeBufferIndex = in_RDI->encodeBufferIndex + 8;
  incrementPayloadSize<unsigned_long>(this_00,(unsigned_long)poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"-> encoded to number of size ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
  std::operator<<(poVar2," in a span.");
  poVar2 = std::operator<<((ostream *)&std::cout,"bufferIndex = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI->encodeBufferIndex);
  poVar2 = std::operator<<(poVar2," ,payloadSize = ");
  sVar6 = getPayloadSize(in_RDI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar6);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void encodeParameter(T&& t, WebSocketFrame& frame) {
        using namespace std;
        using ParamType = remove_cvref_t<T>;
        setParametersCount(getParametersCount() + 1);

        if constexpr (is_printable<T>::value) {
            std::cout << "Param: " << typeName<T>() << " -> " << typeName<ParamType>() << " : " << t << "\n";
        }

        [[maybe_unused]] auto encodeType = [&, this](msg::CodedType type, auto size, WebSocketFrame& wsFrame) {
            wsFrame.addBuffer(std::span(&buffer[encodeBufferIndex], 1 + sizeof(size)));
            buffer[encodeBufferIndex++] = static_cast<std::byte>(type);
            std::copy_n(reinterpret_cast<const std::byte*>(&size), sizeof(size), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(size);
            incrementPayloadSize(1 + sizeof(size));
        };

        [[maybe_unused]] auto encodeString = [&](const char* str, size_t size) constexpr {
            if (size < 256)
                encodeType(msg::CodedType::smallString, static_cast<uint8_t>(size), frame);
            else
                encodeType(msg::CodedType::string, static_cast<uint16_t>(size), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(str), size));
            incrementPayloadSize(size);

            std::cout << "-> encoded to string of size " << size << " in a span.\n";
        };

        if constexpr (is_tuple_v<ParamType>) {
            uint8_t nbParams = static_cast<uint8_t>(tuple_size<ParamType>::value);
            encodeType(msg::CodedType::tuple, nbParams, frame);
            std::apply([&](auto&... tupleArgs) { ((encodeParameter(tupleArgs, frame)), ...); }, t);
        }
        else if constexpr (is_same_v<ParamType, bool>) {
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1));
            buffer[encodeBufferIndex++] = static_cast<byte>(t ? msg::CodedType::booleanTrue : msg::CodedType::booleanFalse);
            incrementPayloadSize(1);
            std::cout << "-> encoded to bool of size " << 1 << " in a span.";
        }
        else if constexpr (is_arithmetic_v<ParamType>) {
            double number = t;
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1 + sizeof(number)));
            buffer[encodeBufferIndex++] = static_cast<byte>(msg::CodedType::number);
            copy_n(reinterpret_cast<const byte*>(&number), sizeof(number), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(number);
            incrementPayloadSize(1 + sizeof(number));
            std::cout << "-> encoded to number of size " << sizeof(number) << " in a span.";
        }

        else if constexpr (is_array_v<ParamType>) {
            using ElementType = remove_all_extents_t<ParamType>;
            //   cout << "Array of " << typeName<ElementType>() << "\n";
            //   cout << typeName<ParamType>() << " is bounded : " << is_bounded_array_v<ParamType> << "\n";
            if constexpr (is_same_v<ElementType, char>) {
                if constexpr (is_bounded_array_v<ParamType>)
                    encodeString(t, extent_v<ParamType> - 1);
                else
                    encodeString(t, char_traits<char>::length(t));
            }
            else
                static_assert(is_same_v<ElementType, char>, "Arrays are not supported by JSFunction");
        }
        else if constexpr (is_same_v<ParamType, const char*>)
            encodeString(t, char_traits<char>::length(t));

        else if constexpr (is_same_v<ParamType, string> or is_same_v<ParamType, string_view>)
            encodeString(t.data(), t.size());

        else if constexpr (is_pointer_v<ParamType>)
            static_assert(!is_pointer_v<ParamType>, "Pointers cannot be used by JSFunction");

        else if constexpr (is_base_of_v<std::exception, ParamType>) {
            std::cout << "Exception : " << t.what() << '\n';
            auto textSize = char_traits<char>::length(t.what());
            encodeType(msg::CodedType::exception, static_cast<uint16_t>(textSize), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(t.what()), textSize));
            incrementPayloadSize(textSize);
        }

        std::cout << "bufferIndex = " << encodeBufferIndex << " ,payloadSize = " << getPayloadSize() << "\n";
    }